

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint flag)

{
  int i;
  iterator iVar1;
  State *pSVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  State *s;
  size_t local_48;
  State state;
  
  s = &state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  iVar1 = std::
          _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->state_cache_)._M_h,&s);
  if (iVar1.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur == (__node_type *)0x0) {
    lVar7 = (long)this->prog_->bytemap_range_;
    lVar3 = ((long)ninst << 0x22) + (lVar7 + 1 << 0x23);
    lVar5 = lVar3 + 0x3000000000 >> 0x20;
    if (this->mem_budget_ < lVar5) {
      this->mem_budget_ = -1;
      s = (State *)0x0;
    }
    else {
      local_48 = (long)ninst << 2;
      this->mem_budget_ = this->mem_budget_ - lVar5;
      uVar4 = lVar3 + 0x1000000000 >> 0x20;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (long)uVar4) {
        uVar6 = uVar4;
      }
      pSVar2 = (State *)operator_new__(uVar6);
      for (lVar3 = 0; lVar3 <= lVar7; lVar3 = lVar3 + 1) {
        (&pSVar2[1].inst_)[lVar3] = (int *)0x0;
      }
      pSVar2->inst_ = &pSVar2[1].ninst_ + lVar7 * 2;
      s = pSVar2;
      memcpy(&pSVar2[1].ninst_ + lVar7 * 2,inst,local_48);
      pSVar2->ninst_ = ninst;
      pSVar2->flag_ = flag;
      std::__detail::
      _Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->state_cache_,&s);
    }
  }
  else {
    s = *(State **)((long)iVar1.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur + 8);
  }
  return s;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint flag) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  State state = {inst, ninst, flag};
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    if (DebugDFA)
      fprintf(stderr, " -cached-> %s\n", DumpState(*it).c_str());
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 32 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 32;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = new char[mem];
  State* s = new (space) State;
  (void) new (s->next_) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  if (DebugDFA)
    fprintf(stderr, " -> %s\n", DumpState(s).c_str());

  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}